

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O2

bool __thiscall
llvm::yaml::document_iterator::operator==(document_iterator *this,document_iterator *Other)

{
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar1;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar2;
  bool bVar3;
  
  puVar1 = this->Doc;
  if (puVar1 == (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0)
  {
    puVar2 = Other->Doc;
  }
  else {
    puVar2 = Other->Doc;
    if ((puVar1->_M_t).
        super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>._M_t
        .super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>.
        super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl != (Document *)0x0) {
      if (puVar2 != (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
                    0x0) {
        return puVar1 == puVar2 &&
               (puVar2->_M_t).
               super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
               .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl != (Document *)0x0
        ;
      }
      return false;
    }
  }
  if (puVar2 == (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0)
  {
    bVar3 = true;
  }
  else {
    bVar3 = (puVar2->_M_t).
            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>.
            _M_t.
            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl == (Document *)0x0;
  }
  return bVar3;
}

Assistant:

bool operator==(const document_iterator &Other) const {
    if (isAtEnd() || Other.isAtEnd())
      return isAtEnd() && Other.isAtEnd();

    return Doc == Other.Doc;
  }